

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  ImVector<ImGuiTextFilter::TextRange> *this_00;
  size_t sVar1;
  value_type *pvVar2;
  int i;
  int i_00;
  TextRange input_range;
  
  this_00 = &this->Filters;
  ImVector<ImGuiTextFilter::TextRange>::resize(this_00,0);
  sVar1 = strlen(this->InputBuf);
  input_range.e = this->InputBuf + sVar1;
  input_range.b = this->InputBuf;
  TextRange::split(&input_range,',',this_00);
  this->CountGrep = 0;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    pvVar2 = ImVector<ImGuiTextFilter::TextRange>::operator[](this_00,i_00);
    TextRange::trim_blanks(pvVar2);
    pvVar2 = ImVector<ImGuiTextFilter::TextRange>::operator[](this_00,i_00);
    if (pvVar2->b != pvVar2->e) {
      pvVar2 = ImVector<ImGuiTextFilter::TextRange>::operator[](this_00,i_00);
      if (*pvVar2->b != '-') {
        this->CountGrep = this->CountGrep + 1;
      }
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}